

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * __thiscall
ON_ManagedFonts::Internal_AddManagedFont
          (ON_ManagedFonts *this,ON_Font *managed_font,
          ON_FontMetrics *managed_font_metrics_in_font_design_units)

{
  Member MVar1;
  bool bVar2;
  ON_FontList *this_00;
  ON_Font *installed_font_00;
  undefined1 local_c0 [8];
  ON_FontMetrics font_metrics_in_font_design_units;
  ON_FontGlyphCache *local_70;
  ON_FontGlyphCache *font_cache;
  ON_FontFaceQuartet default_quartet;
  bool bItalicInQuartet;
  bool bBoldInQuartet;
  ON_Font *local_30;
  ON_Font *installed_font;
  ON_MemoryAllocationTracking disable_tracking;
  ON_FontMetrics *managed_font_metrics_in_font_design_units_local;
  ON_Font *managed_font_local;
  ON_ManagedFonts *this_local;
  
  disable_tracking = (ON_MemoryAllocationTracking)managed_font_metrics_in_font_design_units;
  ON_MemoryAllocationTracking::ON_MemoryAllocationTracking
            ((ON_MemoryAllocationTracking *)&installed_font,false);
  if ((this->m_default_font_ptr == 0) && (managed_font->m_runtime_serial_number == 1)) {
    this->m_default_font_ptr = (ON__UINT_PTR)managed_font;
  }
  this_00 = InstalledFonts();
  installed_font_00 = ON_FontList::FromFontProperties(this_00,managed_font,true,true);
  if (installed_font_00 == (ON_Font *)0x0) {
    default_quartet.m_bold_italic._3_1_ = ON_Font::IsBoldInQuartet(managed_font);
    default_quartet.m_bold_italic._2_1_ = ON_Font::IsItalicInQuartet(managed_font);
    if (managed_font->m_quartet_member == Unset) {
      MVar1 = ON_FontFaceQuartet::MemberFromBoldAndItalic
                        ((bool)(default_quartet.m_bold_italic._3_1_ & 1),
                         (bool)default_quartet.m_bold_italic._2_1_);
      managed_font->m_quartet_member = MVar1;
    }
    ON_Font::InstalledFontQuartet((ON_FontFaceQuartet *)&font_cache,&ON_Font::Default);
    local_30 = ON_FontFaceQuartet::ClosestFace
                         ((ON_FontFaceQuartet *)&font_cache,
                          (bool)(default_quartet.m_bold_italic._3_1_ & 1),
                          (bool)(default_quartet.m_bold_italic._2_1_ & 1));
    if (local_30 == (ON_Font *)0x0) {
      local_30 = &ON_Font::Default;
    }
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font,local_30,true);
    ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)&font_cache);
  }
  else {
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font,installed_font_00,false);
  }
  local_70 = std::__shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(managed_font->m_font_glyph_cache).
                         super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>);
  if (local_70 == (element_type *)0x0) {
    local_70 = ON_FontGlyphCache::New();
    std::shared_ptr<ON_FontGlyphCache>::shared_ptr<ON_FontGlyphCache,void>
              ((shared_ptr<ON_FontGlyphCache> *)&font_metrics_in_font_design_units.m_reserved_ptr,
               local_70);
    std::shared_ptr<ON_FontGlyphCache>::operator=
              (&managed_font->m_font_glyph_cache,
               (shared_ptr<ON_FontGlyphCache> *)&font_metrics_in_font_design_units.m_reserved_ptr);
    std::shared_ptr<ON_FontGlyphCache>::~shared_ptr
              ((shared_ptr<ON_FontGlyphCache> *)&font_metrics_in_font_design_units.m_reserved_ptr);
  }
  if ((local_70 != (ON_FontGlyphCache *)0x0) &&
     (bVar2 = ON_FontMetrics::HeightsAreValid(&local_70->m_font_unit_metrics), !bVar2)) {
    ON_FontMetrics::ON_FontMetrics((ON_FontMetrics *)local_c0);
    if ((disable_tracking == (ON_MemoryAllocationTracking)0x0) ||
       (bVar2 = ON_FontMetrics::HeightsAreValid((ON_FontMetrics *)disable_tracking), !bVar2)) {
      GetFontMetricsInFontDesignUnits(managed_font,(ON_FontMetrics *)local_c0);
    }
    else {
      memcpy(local_c0,(void *)disable_tracking,0x40);
    }
    ON_FontGlyphCache::SetFontMetrics(local_70,(ON_FontMetrics *)local_c0);
  }
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_locale_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_postscript_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_postscript_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_family_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_family_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_face_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_face_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_windows_logfont_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_windows_logfont_name);
  ON_FontList::AddFont(&this->m_managed_fonts,managed_font,false);
  ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking
            ((ON_MemoryAllocationTracking *)&installed_font);
  return managed_font;
}

Assistant:

const ON_Font* ON_ManagedFonts::Internal_AddManagedFont(
  const ON_Font* managed_font,
  const ON_FontMetrics* managed_font_metrics_in_font_design_units
  )
{
  // All memory allocated for managed fonts is permanent app workspace memory.
  ON_MemoryAllocationTracking disable_tracking(false);

  if (0 == m_default_font_ptr && 1 == managed_font->m_runtime_serial_number)
  {
    // ON_Font::Default is constructed after ON_ManagedFonts::List and
    // destroyed before ON_ManagedFonts::List. Therefore ~ON_ManagedFonts()
    // has a pointer to ON_Font::Default that must be ignored during
    // destruction.
    m_default_font_ptr = (ON__UINT_PTR)managed_font;
  }

  const ON_Font* installed_font = InstalledFonts().FromFontProperties(managed_font, true, true);
  if (nullptr != installed_font)
  {
    // This managed font matches an installed font.
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font, installed_font, false);
  }
  else
  {
    // Feb 22, 2021 RH-62974
    // This managed font is not installed on this device.
    // After prototyping several approaches permitting various types
    // of user configured font substitution, Lowell and Dale Lear
    // concluded that using the default font was the best option.
    // If this is a problem for lots of users, then we need a way
    // for users to configure the choice of default font.
    // Current settings:
    // Windows: Arial
    // Apple: Helvetic Neue

    // managed_font is a missing font.
    // We have to substitute the correct quartet member (regular/bold/italic/bold-italic).
    // Since managed_font references a font that is not installed on this device,
    // IsItalicInQuartet() and IsBoldInQuartet() will probably fall through to
    // the fallback best guess sections of those functions.
    const bool bBoldInQuartet = managed_font->IsBoldInQuartet();
    const bool bItalicInQuartet = managed_font->IsItalicInQuartet();
    if (ON_FontFaceQuartet::Member::Unset == managed_font->m_quartet_member)
      managed_font->m_quartet_member = ON_FontFaceQuartet::MemberFromBoldAndItalic(bBoldInQuartet, bItalicInQuartet);

    const ON_FontFaceQuartet default_quartet = ON_Font::Default.InstalledFontQuartet(); // only look at installed quartet!
    installed_font = default_quartet.ClosestFace(bBoldInQuartet, bItalicInQuartet);
    if (nullptr == installed_font)
      installed_font = &ON_Font::Default;
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font, installed_font, true);
  }

  ON_FontGlyphCache* font_cache = managed_font->m_font_glyph_cache.get();
  if (nullptr == font_cache)
  {
    /////////////////////
    //
    // Put the cached glyph information here so we only have one set for each font
    //
    font_cache = ON_FontGlyphCache::New();
    managed_font->m_font_glyph_cache = std::shared_ptr<ON_FontGlyphCache>(font_cache);
  }

  if (nullptr != font_cache)
  {
    if (false == font_cache->m_font_unit_metrics.HeightsAreValid())
    {
      ON_FontMetrics font_metrics_in_font_design_units;

      if (
        nullptr != managed_font_metrics_in_font_design_units
        && managed_font_metrics_in_font_design_units->HeightsAreValid()
        )
      {
        font_metrics_in_font_design_units = *managed_font_metrics_in_font_design_units;
      }
      else
      {
        ON_ManagedFonts::GetFontMetricsInFontDesignUnits(
          managed_font,
          font_metrics_in_font_design_units
        );
      }

      font_cache->SetFontMetrics(font_metrics_in_font_design_units);
    }
  }
  
  // Insulate strings in managed fonts from outside damage.
  Internal_AddManagedFontSingleRefCountString(managed_font->m_locale_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_postscript_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_postscript_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_family_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_family_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_face_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_face_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_windows_logfont_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_windows_logfont_name);

  m_managed_fonts.AddFont(managed_font,false);

  return managed_font;
}